

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

bool __thiscall
HPresolve::removeColumnSingletonInDoubletonInequality(HPresolve *this,int col,int i,int k)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  pointer *pppVar3;
  HTimerPre *this_04;
  vector<double,_std::allocator<double>_> *this_05;
  vector<double,_std::allocator<double>_> *this_06;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *this_07;
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_08;
  double dVar4;
  double dVar5;
  double dVar6;
  value_type vVar7;
  reference pvVar8;
  ostream *poVar9;
  reference pvVar10;
  int j;
  ulong uVar11;
  size_type sVar12;
  size_type __n;
  long lVar13;
  size_type __n_00;
  size_type __n_01;
  size_type __n_02;
  double dVar14;
  pair<double,_double> pVar15;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  int local_12c;
  vector<double,_std::allocator<double>_> bndsJ;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> bndsL;
  vector<double,_std::allocator<double>_> bndsCol;
  pair<int,_double> local_40;
  
  uVar11 = (ulong)(uint)k;
  pvVar2 = &(this->super_HPreData).ARstart;
  __n_02 = (size_type)i;
  pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar2,__n_02);
  sVar12 = (size_type)*pvVar8;
  this_00 = &(this->super_HPreData).flagCol;
  lVar13 = sVar12 << 0x20;
  local_12c = -1;
  while( true ) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar2,(long)(i + 1));
    j = (int)uVar11;
    if ((long)*pvVar8 <= (long)sVar12) break;
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).ARindex,sVar12);
    local_12c = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_00,(long)local_12c);
    j = (int)uVar11;
    if ((local_12c != col) && (*pvVar8 != 0)) break;
    sVar12 = sVar12 + 1;
    lVar13 = lVar13 + 0x100000000;
  }
  pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar2,(long)(i + 1));
  if (*pvVar8 == (int)sVar12) {
    poVar9 = std::operator<<((ostream *)&std::cout,"ERROR: nzRow[");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,i);
    std::operator<<(poVar9,"]=2, but no second variable in row. \n");
  }
  pvVar10 = std::vector<double,_std::allocator<double>_>::at
                      (&(this->super_HPreData).rowLower,__n_02);
  dVar14 = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::at
                      (&(this->super_HPreData).rowUpper,__n_02);
  sVar12 = (size_type)local_12c;
  if ((this->tol <= ABS(dVar14 - *pvVar10)) ||
     (pvVar8 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).nzCol,sVar12),
     *pvVar8 < 2)) {
    this_04 = &this->timer;
    dVar14 = HTimerPre::getWallTime(this_04);
    (this->timer).itemStart[8] = dVar14;
    this_05 = &(this->super_HPreData).ARvalue;
    __n_00 = lVar13 >> 0x20;
    pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
    dVar14 = *pvVar10;
    this_01 = &(this->super_HPreData).Avalue;
    __n = (size_type)k;
    pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
    pVar15 = getNewBoundsDoubletonConstraint(this,i,local_12c,j,dVar14,*pvVar10);
    this_02 = &(this->super_HPreData).colLower;
    __n_01 = (size_type)col;
    pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
    if (*pvVar10 <= pVar15.first) {
      this_06 = &(this->super_HPreData).colUpper;
      pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_06,__n_01);
      if (pVar15.second <= *pvVar10) {
        this_07 = &(this->super_HPreData).postValue;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
        std::deque<double,_std::allocator<double>_>::push_back(&this_07->c,pvVar10);
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
        std::deque<double,_std::allocator<double>_>::push_back(&this_07->c,pvVar10);
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
        dVar14 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
        pVar15 = getNewBoundsDoubletonConstraint(this,i,col,j,dVar14,*pvVar10);
        dVar14 = pVar15.first;
        if (this->iKKTcheck == 1) {
          bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bndsCol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          bndsCol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          bndsCol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bndsJ.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          bndsJ.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          bndsJ.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar12);
          local_40.second = *pvVar10;
          local_40.first = local_12c;
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          emplace_back<std::pair<int,double>>
                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&bndsL,
                     &local_40);
          pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar12);
          local_40.second = *pvVar10;
          local_40.first = local_12c;
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          emplace_back<std::pair<int,double>>
                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&bndsCol
                     ,&local_40);
          pvVar10 = std::vector<double,_std::allocator<double>_>::at
                              (&(this->super_HPreData).colCost,sVar12);
          local_40.second = *pvVar10;
          local_40.first = local_12c;
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          emplace_back<std::pair<int,double>>
                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&bndsJ,
                     &local_40);
          std::
          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
          ::push_back(&(this->super_HPreData).chk.cLowers.c,&bndsL);
          std::
          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
          ::push_back(&(this->super_HPreData).chk.cUppers.c,(value_type *)&bndsCol);
          std::
          deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
          ::push_back(&(this->super_HPreData).chk.costs.c,(value_type *)&bndsJ);
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         *)&bndsJ);
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         *)&bndsCol);
          std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          ~_Vector_base(&bndsL.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       );
        }
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_01);
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)*pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_06,__n_01);
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)*pvVar10;
        this_03 = &(this->super_HPreData).colCost;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_01);
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pvVar10;
        __l._M_len = 3;
        __l._M_array = (iterator)&bndsL;
        std::vector<double,_std::allocator<double>_>::vector(&bndsCol,__l,(allocator_type *)&bndsJ);
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar12);
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)*pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar12);
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)*pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_03,sVar12);
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pvVar10;
        __l_00._M_len = 3;
        __l_00._M_array = (iterator)&bndsL;
        std::vector<double,_std::allocator<double>_>::vector
                  (&bndsJ,__l_00,(allocator_type *)&local_40);
        pppVar3 = &bndsL.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(bndsL.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,col);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)pppVar3,&bndsCol);
        this_08 = &(this->super_HPreData).oldBounds;
        std::
        deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
        ::emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                  ((deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                    *)this_08,(pair<int,_std::vector<double,_std::allocator<double>_>_> *)&bndsL);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)pppVar3);
        pppVar3 = &bndsL.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(bndsL.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,local_12c);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)pppVar3,&bndsJ);
        std::
        deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
        ::emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                  ((deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                    *)this_08,(pair<int,_std::vector<double,_std::allocator<double>_>_> *)&bndsL);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)pppVar3);
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar12);
        if (*pvVar10 <= dVar14 && dVar14 != *pvVar10) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar12);
          *pvVar10 = dVar14;
        }
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar12);
        if (pVar15.second < *pvVar10) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar12);
          *pvVar10 = pVar15.second;
        }
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_03,sVar12);
        dVar14 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_01);
        dVar4 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_05,__n_00);
        dVar5 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
        dVar6 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_03,sVar12);
        *pvVar10 = dVar14 - (dVar4 * dVar5) / dVar6;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,sVar12);
        vVar7 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(&bndsJ,0);
        *pvVar10 = vVar7;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_06,sVar12);
        vVar7 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(&bndsJ,1);
        *pvVar10 = vVar7;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_03,sVar12);
        vVar7 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(&bndsJ,2);
        *pvVar10 = vVar7;
        pppVar3 = &bndsL.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bndsL.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(bndsL.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,local_12c);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)pppVar3,&bndsJ);
        std::
        deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
        ::emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                  ((deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                    *)this_08,(pair<int,_std::vector<double,_std::allocator<double>_>_> *)&bndsL);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)pppVar3);
        if (0 < this->iPrint) {
          poVar9 = std::operator<<((ostream *)&std::cout,"PR: Column singleton ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,col);
          poVar9 = std::operator<<(poVar9," in a doubleton inequality constraint removed. Row ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,i);
          poVar9 = std::operator<<(poVar9," removed. variable left is ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_12c);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_01);
        *pvVar8 = 0;
        fillStackRowBounds(this,i);
        piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 8;
        *piVar1 = *piVar1 + 1;
        piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 8;
        *piVar1 = *piVar1 + 1;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at
                            (&(this->super_HPreData).valueColDual,__n_01);
        *pvVar10 = 0.0;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_03,__n_01);
        dVar14 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
        dVar4 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at
                            (&(this->super_HPreData).valueRowDual,__n_02);
        *pvVar10 = -dVar14 / dVar4;
        addChange(this,8,i,col);
        pvVar2 = &(this->super_HPreData).nzCol;
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar2,sVar12);
        if (*pvVar8 < 2) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar2,sVar12);
          if (*pvVar8 == 1) {
            removeSecondColumnSingletonInDoubletonRow(this,local_12c,i);
          }
        }
        else {
          removeRow(this,i);
        }
        HTimerPre::recordFinish(this_04,8);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&bndsJ.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&bndsCol.super__Vector_base<double,_std::allocator<double>_>);
        return true;
      }
    }
    HTimerPre::recordFinish(this_04,8);
  }
  return false;
}

Assistant:

bool HPresolve::removeColumnSingletonInDoubletonInequality(const int col, const int i, const int k) {
	//second column index j
	//second column row array index kk
	int j = -1;

	//count
	int kk = ARstart.at(i);
	while (kk<ARstart.at(i+1)) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j!=col)
			break;
		else
			++kk;
	}
	if (kk==ARstart.at(i+1))
		cout<<"ERROR: nzRow["<< i<< "]=2, but no second variable in row. \n";

	//only inequality case and case two singletons here,
	//others handled in doubleton equation
	if ((abs(rowLower.at(i) - rowUpper.at(i)) < tol) && (nzCol.at(j) > 1))
		return false;

	timer.recordStart(SING_COL_DOUBLETON_INEQ);
	// additional check if it is indeed implied free
	// needed since we handle inequalities and it may not be true
	// low and upp to be tighter than original bounds for variable col
	// so it is indeed implied free and we can remove it
	pair<double, double> p = getNewBoundsDoubletonConstraint(i, j, col, ARvalue.at(kk), Avalue.at(k));
	if (!(colLower.at(col) <= p.first && colUpper.at(col) >= p.second)) {
		timer.recordFinish(SING_COL_DOUBLETON_INEQ);
		return false;
	}

	postValue.push(ARvalue.at(kk));
	postValue.push(Avalue.at(k));

	//modify bounds on variable j, variable col (k) is substituted out
	//double aik = Avalue.at(k);
	//double aij = Avalue.at(kk);
	p = getNewBoundsDoubletonConstraint(i, col, j, Avalue.at(k), ARvalue.at(kk));
	double low = p.first;
	double upp = p.second;

	//add old bounds of xj to checker and for postsolve
	if (iKKTcheck == 1) {
		vector<pair<int, double> > bndsL, bndsU, costS;
		bndsL.push_back( make_pair( j, colLower.at(j)));
		bndsU.push_back( make_pair( j, colUpper.at(j)));
		costS.push_back( make_pair( j, colCost.at(j)));
		chk.cLowers.push(bndsL);
		chk.cUppers.push(bndsU);
		chk.costs.push(costS);
	}

	vector<double> bndsCol({colLower.at(col), colUpper.at(col), colCost.at(col)});
	vector<double> bndsJ({colLower.at(j), colUpper.at(j), colCost.at(j)});
	oldBounds.push(make_pair( col, bndsCol));
	oldBounds.push(make_pair( j, bndsJ));

	//modify bounds of xj
	if (low > colLower.at(j))
		colLower.at(j) = low;
	if (upp < colUpper.at(j))
		colUpper.at(j) = upp;

	//modify cost of xj
	colCost.at(j) = colCost.at(j) - colCost.at(col)*ARvalue.at(kk)/Avalue.at(k);

	//for postsolve: need the new bounds too
	//oldBounds.push_back(colLower.at(j)); oldBounds.push_back(colUpper.at(j));
	bndsJ.at(0) = (colLower.at(j));
	bndsJ.at(1) = (colUpper.at(j));
	bndsJ.at(2) = (colCost.at(j));
	oldBounds.push(make_pair( j, bndsJ));

	//remove col as free column singleton
	if (iPrint > 0)
		cout<<"PR: Column singleton "<<col<<" in a doubleton inequality constraint removed. Row "<<i<<" removed. variable left is "<<j<<endl;

	flagCol.at(col) = 0;
	fillStackRowBounds(i);
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	countRemovedRows[SING_COL_DOUBLETON_INEQ]++;

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col)/Avalue.at(k); //may be changed later, depending on bounds.
	addChange(SING_COL_DOUBLETON_INEQ, i, col);

	//if not special case two column singletons
	if (nzCol.at(j) > 1)
		removeRow(i);
	else if (nzCol.at(j)==1)
		removeSecondColumnSingletonInDoubletonRow(j, i);

	timer.recordFinish(SING_COL_DOUBLETON_INEQ);
	return true;
}